

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O0

void __thiscall avro::ArrayParser::parse(ArrayParser *this,Reader *reader,uint8_t *address)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  type pRVar4;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  uint8_t *location;
  int64_t i;
  int64_t size;
  GenericArraySetter *setter;
  uint8_t *arrayAddress;
  ReaderImpl<avro::NullValidator> *in_stack_ffffffffffffffc0;
  long local_38;
  
  avro::operator<<((NoOp *)&noop,(char (*) [14])"Reading array");
  lVar1 = *(long *)(in_RDI + 0x18);
  lVar2 = *(long *)(in_RDI + 0x20);
  do {
    iVar3 = ReaderImpl<avro::NullValidator>::readArrayBlockSize(in_stack_ffffffffffffffc0);
    for (local_38 = 0; local_38 < iVar3; local_38 = local_38 + 1) {
      in_stack_ffffffffffffffc0 =
           (ReaderImpl<avro::NullValidator> *)(**(code **)(in_RDX + lVar2))(in_RDX + lVar1);
      pRVar4 = boost::shared_ptr<avro::Resolver>::operator->
                         ((shared_ptr<avro::Resolver> *)(in_RDI + 8));
      (**pRVar4->_vptr_Resolver)(pRVar4,in_RSI,in_stack_ffffffffffffffc0);
    }
  } while (iVar3 != 0);
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        DEBUG_OUT("Reading array");

        uint8_t *arrayAddress = address + offset_;

        GenericArraySetter* setter = reinterpret_cast<GenericArraySetter *> (address + setFuncOffset_);

        int64_t size = 0;
        do {
            size = reader.readArrayBlockSize();
            for(int64_t i = 0; i < size; ++i) {
                // create a new map entry and get the address
                uint8_t *location = (*setter)(arrayAddress);
                resolver_->parse(reader, location);
            }
        } while (size != 0);
    }